

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_path_and_type.cpp
# Opt level: O2

void duckdb::DBPathAndType::ExtractExtensionPrefix(string *path,string *db_type)

{
  string sStack_58;
  string extension;
  
  ExtensionHelper::ExtractExtensionPrefixFromPath(&extension,path);
  if (extension._M_string_length != 0) {
    ::std::__cxx11::string::substr((ulong)&sStack_58,(ulong)path);
    ::std::__cxx11::string::operator=((string *)path,(string *)&sStack_58);
    ::std::__cxx11::string::~string((string *)&sStack_58);
    ExtensionHelper::ApplyExtensionAlias(&sStack_58,&extension);
    ::std::__cxx11::string::operator=((string *)db_type,(string *)&sStack_58);
    ::std::__cxx11::string::~string((string *)&sStack_58);
  }
  ::std::__cxx11::string::~string((string *)&extension);
  return;
}

Assistant:

void DBPathAndType::ExtractExtensionPrefix(string &path, string &db_type) {
	auto extension = ExtensionHelper::ExtractExtensionPrefixFromPath(path);
	if (!extension.empty()) {
		// path is prefixed with an extension - remove the first occurence of it
		path = path.substr(extension.length() + 1);
		db_type = ExtensionHelper::ApplyExtensionAlias(extension);
	}
}